

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_values(parser *p)

{
  errr eVar1;
  errr eVar2;
  char *str;
  int local_38;
  int iStack_34;
  _Bool found;
  wchar_t index;
  wchar_t value;
  char *t;
  char *s;
  object_kind *k;
  parser *p_local;
  
  k = (object_kind *)p;
  s = (char *)parser_priv(p);
  if (s == (char *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    str = parser_getstr((parser *)k,"values");
    t = string_make(str);
    _index = strtok(t," |");
    while (_index != (char *)0x0) {
      iStack_34 = 0;
      local_38 = 0;
      eVar1 = grab_rand_value((random_value *)(s + 0x88),obj_mods,_index);
      eVar2 = grab_index_and_int(&stack0xffffffffffffffcc,&local_38,element_names,"RES_",_index);
      if (eVar2 == 0) {
        *(short *)(s + (long)local_38 * 4 + 0x188) = (short)iStack_34;
      }
      if (eVar2 != 0 && eVar1 != 0) break;
      _index = strtok((char *)0x0," |");
    }
    string_free(t);
    p_local._4_4_ = PARSE_ERROR_NONE;
    if (_index != (char *)0x0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_object_values(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	char *s, *t;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_rand_value(k->modifiers, obj_mods, t)) {
			found = true;
		}
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			k->el_info[index].res_level = value;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}